

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::print_typed_attr<std::array<float,4ul>>
          (string *__return_storage_ptr__,tinyusdz *this,
          TypedAttributeWithFallback<std::array<float,_4UL>_> *attr,string *name,uint32_t indent)

{
  bool bVar1;
  AttrMeta *pAVar2;
  ostream *poVar3;
  array<float,_4UL> *v;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *this_00;
  size_type sVar4;
  const_reference v_00;
  uint32_t indent_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t n;
  uint32_t n_00;
  uint32_t n_01;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *paths;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0 [32];
  string local_1d0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream aoStack_1a0 [380];
  uint32_t local_24;
  TypedAttributeWithFallback<std::array<float,_4UL>_> *pTStack_20;
  uint32_t indent_local;
  string *name_local;
  TypedAttributeWithFallback<std::array<float,_4UL>_> *attr_local;
  
  indent_00 = (uint32_t)name;
  local_24 = indent_00;
  pTStack_20 = attr;
  name_local = (string *)this;
  attr_local = (TypedAttributeWithFallback<std::array<float,_4UL>_> *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  bVar1 = TypedAttributeWithFallback<std::array<float,_4UL>_>::authored
                    ((TypedAttributeWithFallback<std::array<float,_4UL>_> *)name_local);
  if (bVar1) {
    pAVar2 = TypedAttributeWithFallback<std::array<float,_4UL>_>::metas
                       ((TypedAttributeWithFallback<std::array<float,_4UL>_> *)name_local);
    bVar1 = AttrMetas::authored(pAVar2);
    n = extraout_EDX;
    if (((bVar1) ||
        (bVar1 = TypedAttributeWithFallback<std::array<float,_4UL>_>::is_blocked
                           ((TypedAttributeWithFallback<std::array<float,_4UL>_> *)name_local),
        n = extraout_EDX_00, bVar1)) ||
       (bVar1 = TypedAttributeWithFallback<std::array<float,_4UL>_>::is_connection
                          ((TypedAttributeWithFallback<std::array<float,_4UL>_> *)name_local),
       n = extraout_EDX_01, !bVar1)) {
      pprint::Indent_abi_cxx11_(&local_1d0,(pprint *)(ulong)local_24,n);
      ::std::operator<<(aoStack_1a0,(string *)&local_1d0);
      ::std::__cxx11::string::~string((string *)&local_1d0);
      ::std::operator<<(aoStack_1a0,"uniform ");
      value::TypeTraits<std::array<float,4ul>>::type_name_abi_cxx11_();
      poVar3 = ::std::operator<<(aoStack_1a0,local_1f0);
      poVar3 = ::std::operator<<(poVar3," ");
      ::std::operator<<(poVar3,(string *)pTStack_20);
      ::std::__cxx11::string::~string(local_1f0);
      bVar1 = TypedAttributeWithFallback<std::array<float,_4UL>_>::is_blocked
                        ((TypedAttributeWithFallback<std::array<float,_4UL>_> *)name_local);
      if (bVar1) {
        ::std::operator<<(aoStack_1a0," = None");
      }
      else {
        poVar3 = ::std::operator<<(aoStack_1a0," = ");
        v = TypedAttributeWithFallback<std::array<float,_4UL>_>::get_value
                      ((TypedAttributeWithFallback<std::array<float,_4UL>_> *)name_local);
        ::std::operator<<(poVar3,v);
      }
      pAVar2 = TypedAttributeWithFallback<std::array<float,_4UL>_>::metas
                         ((TypedAttributeWithFallback<std::array<float,_4UL>_> *)name_local);
      bVar1 = AttrMetas::authored(pAVar2);
      if (bVar1) {
        poVar3 = ::std::operator<<(aoStack_1a0," (\n");
        pAVar2 = TypedAttributeWithFallback<std::array<float,_4UL>_>::metas
                           ((TypedAttributeWithFallback<std::array<float,_4UL>_> *)name_local);
        print_attr_metas_abi_cxx11_
                  (&local_210,(tinyusdz *)pAVar2,(AttrMeta *)(ulong)(local_24 + 1),indent_00);
        poVar3 = ::std::operator<<(poVar3,(string *)&local_210);
        pprint::Indent_abi_cxx11_(&local_230,(pprint *)(ulong)local_24,n_00);
        poVar3 = ::std::operator<<(poVar3,(string *)&local_230);
        ::std::operator<<(poVar3,")");
        ::std::__cxx11::string::~string((string *)&local_230);
        ::std::__cxx11::string::~string((string *)&local_210);
      }
      ::std::operator<<(aoStack_1a0,"\n");
    }
    bVar1 = TypedAttributeWithFallback<std::array<float,_4UL>_>::has_connections
                      ((TypedAttributeWithFallback<std::array<float,_4UL>_> *)name_local);
    if (bVar1) {
      pprint::Indent_abi_cxx11_(&local_250,(pprint *)(ulong)local_24,n_01);
      ::std::operator<<(aoStack_1a0,(string *)&local_250);
      ::std::__cxx11::string::~string((string *)&local_250);
      ::std::operator<<(aoStack_1a0,"uniform ");
      value::TypeTraits<std::array<float,4ul>>::type_name_abi_cxx11_();
      poVar3 = ::std::operator<<(aoStack_1a0,(string *)&paths);
      poVar3 = ::std::operator<<(poVar3," ");
      ::std::operator<<(poVar3,(string *)pTStack_20);
      ::std::__cxx11::string::~string((string *)&paths);
      ::std::operator<<(aoStack_1a0,".connect = ");
      this_00 = TypedAttributeWithFallback<std::array<float,_4UL>_>::get_connections
                          ((TypedAttributeWithFallback<std::array<float,_4UL>_> *)name_local);
      sVar4 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)this_00);
      if (sVar4 == 1) {
        v_00 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[](this_00,0)
        ;
        ::std::operator<<(aoStack_1a0,v_00);
      }
      else {
        sVar4 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)this_00);
        if (sVar4 == 0) {
          ::std::operator<<(aoStack_1a0,"[InternalError]");
        }
        else {
          ::std::operator<<(aoStack_1a0,this_00);
        }
      }
    }
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(const TypedAttributeWithFallback<T> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    // default
    if (attr.metas().authored() || attr.is_blocked() || (!attr.is_connection())) {
      ss << pprint::Indent(indent);
      ss << "uniform ";
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else {
        ss << " = " << attr.get_value();
      }

      if (attr.metas().authored()) {
        ss << " (\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    if (attr.has_connections()) {
      ss << pprint::Indent(indent);
      ss << "uniform ";
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".connect = ";

      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
    }
  }

  return ss.str();
}